

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O2

int unpackControlTypes(ControlTypes controls,ControlType *array)

{
  int iVar1;
  int i;
  int iVar2;
  ControlType CVar3;
  long lVar4;
  
  if ((QFlagsStorage<QSizePolicy::ControlType>)
      controls.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
      super_QFlagsStorage<QSizePolicy::ControlType>.i !=
      (QFlagsStorage<QSizePolicy::ControlType>)0x0) {
    if ((int)controls.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
             super_QFlagsStorage<QSizePolicy::ControlType>.i - 1U <
        ((uint)controls.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
               super_QFlagsStorage<QSizePolicy::ControlType>.i ^
        (int)controls.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
             super_QFlagsStorage<QSizePolicy::ControlType>.i - 1U)) {
      *array = (ControlType)
               controls.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
               super_QFlagsStorage<QSizePolicy::ControlType>.i;
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      for (iVar2 = 0; iVar2 != 0x20; iVar2 = iVar2 + 1) {
        CVar3 = 1 << ((byte)iVar2 & 0x1f) &
                (uint)controls.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
                      super_QFlagsStorage<QSizePolicy::ControlType>.i;
        if (CVar3 != 0) {
          lVar4 = (long)iVar1;
          iVar1 = iVar1 + 1;
          array[lVar4] = CVar3;
        }
      }
    }
    return iVar1;
  }
  return 0;
}

Assistant:

constexpr inline bool operator!() const noexcept { return !i; }